

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraCodeBlocksGenerator::CreateDummyTargetFile_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmLocalGenerator *lg,
          cmGeneratorTarget *target)

{
  string *psVar1;
  string *psVar2;
  ostream *poVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmGeneratedFileStream fout;
  long *local_320 [2];
  long local_310 [2];
  undefined8 local_300;
  undefined8 local_2f8;
  undefined1 *local_2f0;
  undefined1 local_2e8 [32];
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined1 *local_2b8;
  undefined1 local_2b0 [32];
  undefined1 local_290 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  undefined8 local_278;
  undefined1 *local_270;
  undefined8 local_268;
  undefined8 local_260;
  long *local_258;
  long **local_250;
  undefined8 local_248;
  undefined1 *local_240;
  undefined8 local_238;
  size_type local_230;
  pointer local_228;
  undefined8 local_220;
  undefined8 local_218;
  char *local_210;
  undefined8 local_208;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(lg);
  (*(lg->super_cmOutputConverter)._vptr_cmOutputConverter[0x10])(local_320,lg,target);
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  local_290._8_8_ = (psVar1->_M_dataplus)._M_p;
  local_290._0_8_ = psVar1->_M_string_length;
  local_280 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2b8 = local_2b0;
  local_2c8 = 0;
  local_2c0 = 1;
  local_2b0[0] = 0x2f;
  local_278 = 1;
  local_268 = 0;
  local_260 = local_320[1];
  local_258 = local_320[0];
  local_2f0 = local_2e8;
  local_300 = 0;
  local_2f8 = 1;
  local_2e8[0] = 0x2f;
  local_248 = 1;
  local_238 = 0;
  local_228 = (psVar2->_M_dataplus)._M_p;
  local_230 = psVar2->_M_string_length;
  local_220 = 0;
  local_218 = 7;
  local_210 = ".objlib";
  local_208 = 0;
  views._M_len = 6;
  views._M_array = (iterator)local_290;
  local_270 = local_2b8;
  local_250 = local_320;
  local_240 = local_2f0;
  cmCatViews(__return_storage_ptr__,views);
  if (local_320[0] != local_310) {
    operator_delete(local_320[0],local_310[0] + 1);
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_290,__return_storage_ptr__,false,None);
  if ((*(byte *)((long)&local_270 + (long)*(_func_int **)(local_290._0_8_ + -0x18)) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_290,"# This is a dummy file for the OBJECT library ",0x2e);
    psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_290,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," for the CMake CodeBlocks project generator.\n",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"# Don\'t edit, this file will be overwritten.\n",0x2d);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_290);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::CreateDummyTargetFile(
  cmLocalGenerator* lg, cmGeneratorTarget* target) const
{
  // this file doesn't seem to be used by C::B in custom makefile mode,
  // but we generate a unique file for each OBJECT library so in case
  // C::B uses it in some way, the targets don't interfere with each other.
  std::string filename = cmStrCat(lg->GetCurrentBinaryDirectory(), '/',
                                  lg->GetTargetDirectory(target), '/',
                                  target->GetName(), ".objlib");
  cmGeneratedFileStream fout(filename);
  if (fout) {
    /* clang-format off */
    fout << "# This is a dummy file for the OBJECT library "
         << target->GetName()
         << " for the CMake CodeBlocks project generator.\n"
         << "# Don't edit, this file will be overwritten.\n";
    /* clang-format on */
  }
  return filename;
}